

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  sColMap *psVar1;
  sqlite3 *db;
  Table *pTVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  FKey *data;
  FKey *pFVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char **ppcVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  u64 n;
  sColMap *z;
  undefined1 *puVar14;
  undefined1 *pTo_00;
  char *pcVar15;
  
  db = pParse->db;
  pTVar2 = pParse->pNewTable;
  if ((pTVar2 != (Table *)0x0) && (pParse->eParseMode != '\x01')) {
    if (pFromCol == (ExprList *)0x0) {
      if (0 < pTVar2->nCol) {
        uVar8 = 1;
        if ((pToCol == (ExprList *)0x0) || (pToCol->nExpr == 1)) goto LAB_0015f95a;
        sqlite3ErrorMsg(pParse,"foreign key on %s should reference only one column of table %T",
                        pTVar2->aCol[(ushort)pTVar2->nCol - 1].zCnName,pTo);
      }
    }
    else {
      uVar8 = (ulong)(uint)pFromCol->nExpr;
      if ((pToCol == (ExprList *)0x0) || (pToCol->nExpr == pFromCol->nExpr)) {
LAB_0015f95a:
        iVar7 = (int)uVar8;
        n = (long)iVar7 * 0x10 + (ulong)pTo->n + 0x41;
        if (pToCol != (ExprList *)0x0) {
          uVar9 = 0;
          uVar12 = (ulong)(uint)pToCol->nExpr;
          if (pToCol->nExpr < 1) {
            uVar12 = uVar9;
          }
          for (; uVar12 * 0x18 - uVar9 != 0; uVar9 = uVar9 + 0x18) {
            uVar3 = sqlite3Strlen30(*(char **)((long)&pToCol->a[0].zEName + uVar9));
            n = n + uVar3 + 1;
          }
        }
        data = (FKey *)sqlite3DbMallocZero(db,n);
        if (data == (FKey *)0x0) {
          data = (FKey *)0x0;
        }
        else {
          data->pFrom = pTVar2;
          data->pNextFrom = (pTVar2->u).tab.pFKey;
          z = data->aCol + iVar7;
          data->zTo = (char *)z;
          if (1 < pParse->eParseMode) {
            sqlite3RenameTokenMap(pParse,z,pTo);
          }
          psVar1 = data->aCol;
          memcpy(z,pTo->z,(ulong)pTo->n);
          *(undefined1 *)((long)&z->iFrom + (ulong)pTo->n) = 0;
          sqlite3Dequote((char *)z);
          uVar3 = pTo->n;
          data->nCol = iVar7;
          if (pFromCol == (ExprList *)0x0) {
            psVar1->iFrom = pTVar2->nCol + -1;
          }
          else {
            uVar12 = 0;
            if (0 < iVar7) {
              uVar12 = uVar8;
            }
            for (uVar9 = 0; uVar9 != uVar12; uVar9 = uVar9 + 1) {
              uVar4 = (uint)(ushort)pTVar2->nCol;
              if (pTVar2->nCol < 1) {
                uVar4 = 0;
              }
              lVar13 = 0;
              uVar11 = 0;
              while( true ) {
                if (uVar4 == uVar11) {
                  sqlite3ErrorMsg(pParse,"unknown column \"%s\" in foreign key definition",
                                  pFromCol->a[uVar9 & 0xffffffff].zEName);
                  goto LAB_0015f8ea;
                }
                pcVar15 = pFromCol->a[uVar9].zEName;
                iVar5 = sqlite3StrICmp(*(char **)((long)&pTVar2->aCol->zCnName + lVar13),pcVar15);
                if (iVar5 == 0) break;
                uVar11 = uVar11 + 1;
                lVar13 = lVar13 + 0x10;
              }
              psVar1[uVar9].iFrom = (int)uVar11;
              if (1 < pParse->eParseMode) {
                sqlite3RenameTokenRemap(pParse,psVar1 + uVar9,pcVar15);
              }
            }
          }
          if (pToCol != (ExprList *)0x0) {
            pTo_00 = (undefined1 *)((long)&z->iFrom + (ulong)(uVar3 + 1));
            uVar12 = 0;
            if (iVar7 < 1) {
              uVar8 = uVar12;
            }
            ppcVar10 = &pToCol->a[0].zEName;
            for (; uVar8 * 0x10 != uVar12; uVar12 = uVar12 + 0x10) {
              pcVar15 = *ppcVar10;
              uVar3 = sqlite3Strlen30(pcVar15);
              *(undefined1 **)((long)&data->aCol[0].zCol + uVar12) = pTo_00;
              if (1 < pParse->eParseMode) {
                sqlite3RenameTokenRemap(pParse,pTo_00,pcVar15);
                pcVar15 = *ppcVar10;
              }
              memcpy(pTo_00,pcVar15,(ulong)uVar3);
              puVar14 = pTo_00 + uVar3;
              pTo_00 = puVar14 + 1;
              *puVar14 = 0;
              ppcVar10 = ppcVar10 + 3;
            }
          }
          data->isDeferred = '\0';
          data->aAction[0] = (u8)flags;
          data->aAction[1] = (u8)((uint)flags >> 8);
          pFVar6 = (FKey *)sqlite3HashInsert(&pTVar2->pSchema->fkeyHash,data->zTo,data);
          if (pFVar6 == data) {
            sqlite3OomFault(db);
          }
          else {
            if (pFVar6 != (FKey *)0x0) {
              data->pNextTo = pFVar6;
              pFVar6->pPrevTo = data;
            }
            (pTVar2->u).tab.pFKey = data;
            data = (FKey *)0x0;
          }
        }
        goto LAB_0015f8ea;
      }
      sqlite3ErrorMsg(pParse,
                      "number of columns in foreign key does not match the number of columns in the referenced table"
                     );
    }
  }
  data = (FKey *)0x0;
LAB_0015f8ea:
  sqlite3DbFree(db,data);
  sqlite3ExprListDelete(db,pFromCol);
  sqlite3ExprListDelete(db,pToCol);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  i64 nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zCnName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zEName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  assert( IsOrdinaryTable(p) );
  pFKey->pNextFrom = p->u.tab.pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenMap(pParse, (void*)z, pTo);
  }
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zCnName, pFromCol->a[i].zEName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse,
          "unknown column \"%s\" in foreign key definition",
          pFromCol->a[i].zEName);
        goto fk_end;
      }
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, &pFKey->aCol[i], pFromCol->a[i].zEName);
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zEName);
      pFKey->aCol[i].zCol = z;
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, z, pToCol->a[i].zEName);
      }
      memcpy(z, pToCol->a[i].zEName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash,
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    sqlite3OomFault(db);
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  assert( IsOrdinaryTable(p) );
  p->u.tab.pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}